

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
::internal_clear(btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                 *this,node_type *node)

{
  bool bVar1;
  byte bVar2;
  node_type *alloc;
  int i;
  size_type sVar3;
  
  alloc = node;
  bVar1 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
          ::leaf(node);
  if (bVar1) {
    delete_leaf_node(this,node);
    return;
  }
  sVar3 = 0;
  while( true ) {
    bVar2 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            ::count(node);
    if (bVar2 < sVar3) break;
    alloc = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            ::child(node,sVar3);
    internal_clear(this,alloc);
    sVar3 = sVar3 + 1;
  }
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  ::destroy(node,(allocator_type *)alloc);
  sVar3 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
          ::InternalSize();
  Deallocate<8ul,std::allocator<phmap::test_internal::MovableOnlyInstance>>
            ((allocator<phmap::test_internal::MovableOnlyInstance> *)this,node,sVar3);
  return;
}

Assistant:

void btree<P>::internal_clear(node_type *node) {
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                internal_clear(node->child(i));
            }
            delete_internal_node(node);
        } else {
            delete_leaf_node(node);
        }
    }